

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_rand.cpp
# Opt level: O2

void __thiscall crnlib::ranctx::seed(ranctx *this,uint32 seed)

{
  int iVar1;
  bool bVar2;
  
  this->a = 0xf1ea5eed;
  this->d = seed;
  this->c = seed;
  this->b = seed;
  iVar1 = 0x14;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    next(this);
  }
  return;
}

Assistant:

void ranctx::seed(uint32 seed) {
  a = 0xf1ea5eed, b = c = d = seed;
  for (uint32 i = 0; i < 20; ++i)
    next();
}